

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasreaditemcompressed_v2.cpp
# Opt level: O0

void __thiscall
LASreadItemCompressed_POINT10_v2::LASreadItemCompressed_POINT10_v2
          (LASreadItemCompressed_POINT10_v2 *this,ArithmeticDecoder *dec)

{
  ArithmeticModel *pAVar1;
  IntegerCompressor *pIVar2;
  I32 *local_88;
  StreamingMedian5 *local_70;
  StreamingMedian5 *local_58;
  U16 *local_48;
  U8 *local_30;
  uint local_28;
  U32 i;
  ArithmeticDecoder *dec_local;
  LASreadItemCompressed_POINT10_v2 *this_local;
  
  LASreadItemCompressed::LASreadItemCompressed(&this->super_LASreadItemCompressed);
  (this->super_LASreadItemCompressed).super_LASreadItem._vptr_LASreadItem =
       (_func_int **)&PTR_read_001b00f8;
  this->last_item[0] = '\0';
  local_30 = this->last_item + 1;
  do {
    *local_30 = '\0';
    local_30 = local_30 + 1;
  } while ((U16 *)local_30 != this->last_intensity);
  this->last_intensity[0] = 0;
  local_48 = this->last_intensity + 1;
  do {
    *local_48 = 0;
    local_48 = local_48 + 1;
  } while ((StreamingMedian5 *)local_48 != this->last_x_diff_median5);
  local_58 = this->last_x_diff_median5;
  do {
    StreamingMedian5::StreamingMedian5(local_58);
    local_58 = local_58 + 1;
  } while (local_58 != this->last_y_diff_median5);
  local_70 = this->last_y_diff_median5;
  do {
    StreamingMedian5::StreamingMedian5(local_70);
    local_70 = local_70 + 1;
  } while (local_70 != (StreamingMedian5 *)this->last_height);
  this->last_height[0] = 0;
  local_88 = this->last_height + 1;
  do {
    *local_88 = 0;
    local_88 = local_88 + 1;
  } while (local_88 != (I32 *)&this->field_0x364);
  if (dec != (ArithmeticDecoder *)0x0) {
    this->dec = dec;
    pAVar1 = ArithmeticDecoder::createSymbolModel(dec,0x40);
    this->m_changed_values = pAVar1;
    pIVar2 = (IntegerCompressor *)operator_new(0x48);
    IntegerCompressor::IntegerCompressor(pIVar2,dec,0x10,4,8,0);
    this->ic_intensity = pIVar2;
    pAVar1 = ArithmeticDecoder::createSymbolModel(dec,0x100);
    this->m_scan_angle_rank[0] = pAVar1;
    pAVar1 = ArithmeticDecoder::createSymbolModel(dec,0x100);
    this->m_scan_angle_rank[1] = pAVar1;
    pIVar2 = (IntegerCompressor *)operator_new(0x48);
    IntegerCompressor::IntegerCompressor(pIVar2,dec,0x10,1,8,0);
    this->ic_point_source_ID = pIVar2;
    for (local_28 = 0; local_28 < 0x100; local_28 = local_28 + 1) {
      this->m_bit_byte[local_28] = (ArithmeticModel *)0x0;
      this->m_classification[local_28] = (ArithmeticModel *)0x0;
      this->m_user_data[local_28] = (ArithmeticModel *)0x0;
    }
    pIVar2 = (IntegerCompressor *)operator_new(0x48);
    IntegerCompressor::IntegerCompressor(pIVar2,dec,0x20,2,8,0);
    this->ic_dx = pIVar2;
    pIVar2 = (IntegerCompressor *)operator_new(0x48);
    IntegerCompressor::IntegerCompressor(pIVar2,dec,0x20,0x16,8,0);
    this->ic_dy = pIVar2;
    pIVar2 = (IntegerCompressor *)operator_new(0x48);
    IntegerCompressor::IntegerCompressor(pIVar2,dec,0x20,0x14,8,0);
    this->ic_z = pIVar2;
    return;
  }
  __assert_fail("dec",
                "/workspace/llm4binary/github/license_c_cmakelists/LASzip[P]LASzip/src/lasreaditemcompressed_v2.cpp"
                ,0x3a,
                "LASreadItemCompressed_POINT10_v2::LASreadItemCompressed_POINT10_v2(ArithmeticDecoder *)"
               );
}

Assistant:

LASreadItemCompressed_POINT10_v2::LASreadItemCompressed_POINT10_v2(ArithmeticDecoder* dec)
{
  U32 i;

  /* set decoder */
  assert(dec);
  this->dec = dec;

  /* create models and integer compressors */
  m_changed_values = dec->createSymbolModel(64);
  ic_intensity = new IntegerCompressor(dec, 16, 4);
  m_scan_angle_rank[0] = dec->createSymbolModel(256);
  m_scan_angle_rank[1] = dec->createSymbolModel(256);
  ic_point_source_ID = new IntegerCompressor(dec, 16);
  for (i = 0; i < 256; i++)
  {
    m_bit_byte[i] = 0;
    m_classification[i] = 0;
    m_user_data[i] = 0;
  }
  ic_dx = new IntegerCompressor(dec, 32, 2);  // 32 bits, 2 context
  ic_dy = new IntegerCompressor(dec, 32, 22); // 32 bits, 22 contexts
  ic_z = new IntegerCompressor(dec, 32, 20);  // 32 bits, 20 contexts
}